

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O1

void cdataBlockDebug(void *ctx,xmlChar *value,int len)

{
  xmllintState *lint;
  
  *(int *)((long)ctx + 0x28) = *(int *)((long)ctx + 0x28) + 1;
  if (*(int *)((long)ctx + 0x3c) != 0) {
    return;
  }
  fprintf(_stdout,"SAX.pcdata(%.20s, %d)\n",value,len);
  return;
}

Assistant:

static void
cdataBlockDebug(void *ctx, const xmlChar *value, int len)
{
    xmllintState *lint = ctx;

    lint->callbacks++;
    if (lint->noout)
	return;
    fprintf(stdout, "SAX.pcdata(%.20s, %d)\n",
	    (char *) value, len);
}